

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueue.h
# Opt level: O0

bool __thiscall
rigtorp::SPSCQueue<TestType,_std::allocator<TestType>_>::try_emplace<>
          (SPSCQueue<TestType,_std::allocator<TestType>_> *this)

{
  __int_type_conflict _Var1;
  size_t local_78;
  __int_type_conflict nextWriteIdx;
  __int_type_conflict writeIdx;
  SPSCQueue<TestType,_std::allocator<TestType>_> *this_local;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_2;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  _Var1 = (this->writeIdx_).super___atomic_base<unsigned_long>._M_i;
  local_78 = _Var1 + 1;
  if (local_78 == this->capacity_) {
    local_78 = 0;
  }
  if (local_78 == this->readIdxCache_) {
    std::operator&(memory_order_acquire,__memory_order_mask);
    this->readIdxCache_ = (this->readIdx_).super___atomic_base<unsigned_long>._M_i;
    if (local_78 == this->readIdxCache_) {
      return false;
    }
  }
  TestType::TestType(this->slots_ + _Var1 + 0x40);
  std::operator&(memory_order_release,__memory_order_mask);
  (this->writeIdx_).super___atomic_base<unsigned_long>._M_i = local_78;
  return true;
}

Assistant:

RIGTORP_NODISCARD bool try_emplace(Args &&...args) noexcept(
      std::is_nothrow_constructible<T, Args &&...>::value) {
    static_assert(std::is_constructible<T, Args &&...>::value,
                  "T must be constructible with Args&&...");
    auto const writeIdx = writeIdx_.load(std::memory_order_relaxed);
    auto nextWriteIdx = writeIdx + 1;
    if (nextWriteIdx == capacity_) {
      nextWriteIdx = 0;
    }
    if (nextWriteIdx == readIdxCache_) {
      readIdxCache_ = readIdx_.load(std::memory_order_acquire);
      if (nextWriteIdx == readIdxCache_) {
        return false;
      }
    }
    new (&slots_[writeIdx + kPadding]) T(std::forward<Args>(args)...);
    writeIdx_.store(nextWriteIdx, std::memory_order_release);
    return true;
  }